

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID ImGui::GetKeyOwner(ImGuiKey key)

{
  ImGuiID IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiKeyOwnerData *pIVar4;
  ImGuiID IVar5;
  
  bVar3 = IsNamedKeyOrModKey(key);
  pIVar2 = GImGui;
  IVar5 = 0xffffffff;
  if (bVar3) {
    pIVar4 = GetKeyOwnerData(key);
    IVar1 = pIVar4->OwnerCurr;
    if ((((pIVar2->ActiveIdUsingAllKeyboardKeys != true) || (0x68 < key - ImGuiKey_NamedKey_BEGIN))
        || (IVar1 == 0)) || (IVar1 == pIVar2->ActiveId)) {
      IVar5 = IVar1;
    }
  }
  return IVar5;
}

Assistant:

ImGuiID ImGui::GetKeyOwner(ImGuiKey key)
{
    if (!IsNamedKeyOrModKey(key))
        return ImGuiKeyOwner_None;

    ImGuiContext& g = *GImGui;
    ImGuiKeyOwnerData* owner_data = GetKeyOwnerData(key);
    ImGuiID owner_id = owner_data->OwnerCurr;

    if (g.ActiveIdUsingAllKeyboardKeys && owner_id != g.ActiveId && owner_id != ImGuiKeyOwner_Any)
        if (key >= ImGuiKey_Keyboard_BEGIN && key < ImGuiKey_Keyboard_END)
            return ImGuiKeyOwner_None;

    return owner_id;
}